

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void absl::lts_20250127::log_internal::anon_unknown_4::WriteToStream(char *data,void *os)

{
  size_t sVar1;
  
  if (data != (char *)0x0) {
    sVar1 = strlen(data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,data,sVar1);
    return;
  }
  std::ios::clear((int)os + (int)*(undefined8 *)(*os + -0x18));
  return;
}

Assistant:

void WriteToStream(const char* data, void* os) {
  auto* cast_os = static_cast<std::ostream*>(os);
  *cast_os << data;
}